

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layoutnode.h
# Opt level: O2

void __thiscall rengine::LayoutEngine::updateLayout(LayoutEngine *this,Node *parentNode)

{
  byte bVar1;
  Node *pNVar2;
  int iVar3;
  ulong uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  rect2d rect;
  rect2d local_98;
  float local_88;
  undefined4 uStack_84;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  float local_78;
  undefined4 uStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  undefined1 local_68 [16];
  float local_4c;
  undefined1 local_48 [16];
  float local_38;
  float local_34;
  
  bVar1 = this->field_0x28 & 3;
  if (bVar1 < 2) {
    fVar11 = this->cellWidth;
    if (((fVar11 == 0.0) && (!NAN(fVar11))) &&
       (((this->width == 0.0 && (!NAN(this->width))) || (this->columnCount < 1)))) {
      __assert_fail("cellWidth != 0 || (width != 0 && columnCount > 0)",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/include/scenegraph/layoutnode.h"
                    ,0xdb,"void rengine::LayoutEngine::updateLayout(Node *)");
    }
    fVar9 = this->cellHeight;
    if ((fVar9 != 0.0) || (NAN(fVar9))) {
      fVar12 = ABS(fVar11);
      fVar11 = *(float *)(&DAT_0013c2d8 + (ulong)(0.0 < fVar11) * 4);
      local_78 = ABS(fVar9);
    }
    else {
      fVar9 = this->height;
      if (((fVar9 == 0.0) && (!NAN(fVar9))) || (iVar6 = this->rowCount, iVar6 < 1)) {
        __assert_fail("cellHeight != 0 || (height != 0 && rowCount > 0)",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/include/scenegraph/layoutnode.h"
                      ,0xdc,"void rengine::LayoutEngine::updateLayout(Node *)");
      }
      fVar10 = this->margin * -2.0;
      fVar12 = ((ABS(this->width) + fVar10) - (float)(this->columnCount + -1) * this->spacing) /
               (float)this->columnCount;
      fVar11 = *(float *)(&DAT_0013c2d8 + (ulong)(0.0 < this->width) * 4);
      local_78 = ((ABS(fVar9) + fVar10) - (float)(iVar6 + -1) * this->spacing) / (float)iVar6;
    }
    iVar6 = 0x7fffffff;
    if (0 < (&this->columnCount)[bVar1 != 0]) {
      iVar6 = (&this->columnCount)[bVar1 != 0];
    }
    local_88 = *(float *)(&DAT_00139c10 + (ulong)(fVar9 < 0.0) * 4);
    pNVar2 = parentNode->m_child;
    local_34 = fVar12 * fVar11;
    local_38 = local_88 * local_78;
    iVar7 = 0;
    local_48 = ZEXT416((uint)fVar12);
    uStack_74 = 0;
    uStack_70 = 0;
    uStack_6c = 0;
    local_68._0_4_ = fVar11;
    while (pNVar2 != (Node *)0x0) {
      if ((pNVar2->field_0x30 & 0x40) != 0) {
        if ((this->field_0x28 & 3) == 0) {
          iVar5 = iVar7 / iVar6;
          iVar3 = iVar7 % iVar6;
        }
        else {
          iVar3 = iVar7 / iVar6;
          iVar5 = iVar7 % iVar6;
        }
        local_98.tl.x =
             ((float)iVar3 * this->spacing + (float)iVar3 * fVar12 + this->margin) * fVar11 +
             this->x;
        fVar11 = ((float)iVar5 * this->spacing + (float)iVar5 * local_78 + this->margin) * local_88
                 + this->y;
        local_98.tl.y = fVar11;
        local_98.br.y = local_38 + fVar11;
        local_98.br.x = local_34 + local_98.tl.x;
        rect = rect2d::normalized(&local_98);
        RectangleNodeBase::setGeometry((RectangleNodeBase *)pNVar2,rect);
        iVar7 = iVar7 + 1;
      }
      pNVar2 = Node::sibling(pNVar2);
      fVar12 = (float)local_48._0_4_;
      fVar11 = (float)local_68._0_4_;
    }
  }
  else {
    if (bVar1 == 2) {
      local_38 = this->width;
      local_88 = (float)(~-(uint)(local_38 < 0.0) & 0x3f800000 |
                        -(uint)(local_38 < 0.0) & 0xbf800000);
      uVar8 = -(uint)(this->height < 0.0);
      fVar11 = (float)(~uVar8 & 0x3f800000 | uVar8 & 0xbf800000);
      iVar6 = this->columnCount;
    }
    else {
      local_38 = this->height;
      local_88 = (float)(~-(uint)(local_38 < 0.0) & 0x3f800000 |
                        -(uint)(local_38 < 0.0) & 0xbf800000);
      uVar8 = -(uint)(this->width < 0.0);
      fVar11 = (float)(~uVar8 & 0x3f800000 | uVar8 & 0xbf800000);
      iVar6 = this->rowCount;
    }
    local_48 = ZEXT416((uint)fVar11);
    iVar7 = 0x7fffffff;
    if (0 < iVar6) {
      iVar7 = iVar6;
    }
    if ((local_38 != 0.0) || (NAN(local_38))) {
      fVar9 = this->margin * local_88;
      local_38 = local_38 - (fVar9 + fVar9);
    }
    else {
      local_38 = local_88 * INFINITY;
    }
    local_78 = local_88 * this->margin;
    local_68 = ZEXT416((uint)(this->margin * fVar11));
    pNVar2 = parentNode->m_child;
    local_38 = local_38 * local_88;
    iVar6 = 0;
    local_34 = 0.0;
    uStack_84 = 0;
    uStack_80 = 0;
    uStack_7c = 0;
    while (pNVar2 != (Node *)0x0) {
      if ((pNVar2->field_0x30 & 0x40) == 0) {
LAB_00136162:
        pNVar2 = Node::sibling(pNVar2);
      }
      else {
        bVar1 = this->field_0x28 & 3;
        uVar4 = (ulong)(bVar1 != 2);
        fVar11 = (*(float *)((long)&pNVar2[1].super_SignalEmitter._vptr_SignalEmitter +
                            uVar4 * 4 + 4) - *(float *)(&pNVar2->field_0x34 + uVar4 * 4)) * local_88
                 + local_78;
        if ((local_88 * fVar11 <= local_38 && iVar6 < iVar7) || (iVar6 == 0)) {
          if (bVar1 == 2) {
            fVar10 = local_78;
            if (this->x + local_88 <= 0.0) {
              fVar10 = local_78 -
                       (*(float *)((long)&pNVar2[1].super_SignalEmitter._vptr_SignalEmitter + 4) -
                       *(float *)&pNVar2->field_0x34);
            }
            fVar9 = *(float *)&pNVar2[1].super_SignalEmitter.m_buckets -
                    *(float *)&pNVar2[1].super_SignalEmitter._vptr_SignalEmitter;
            fVar12 = fVar9;
            if (fVar9 <= local_34) {
              fVar12 = local_34;
            }
            uVar8 = -(uint)(0.0 < this->y + (float)local_48._0_4_);
            fVar9 = (float)(uVar8 & local_68._0_4_ | ~uVar8 & (uint)((float)local_68._0_4_ - fVar9))
            ;
            local_34 = fVar12;
          }
          else {
            fVar9 = local_78;
            if (this->y + local_88 <= 0.0) {
              fVar9 = local_78 -
                      (*(float *)&pNVar2[1].super_SignalEmitter.m_buckets -
                      *(float *)&pNVar2[1].super_SignalEmitter._vptr_SignalEmitter);
            }
            fVar10 = *(float *)((long)&pNVar2[1].super_SignalEmitter._vptr_SignalEmitter + 4) -
                     *(float *)&pNVar2->field_0x34;
            fVar12 = fVar10;
            if (fVar10 <= local_34) {
              fVar12 = local_34;
            }
            uVar8 = -(uint)(0.0 < this->x + (float)local_48._0_4_);
            fVar10 = (float)(uVar8 & local_68._0_4_ |
                            ~uVar8 & (uint)((float)local_68._0_4_ - fVar10));
            local_34 = fVar12;
          }
          local_4c = fVar11;
          RectangleNodeBase::setPosition((RectangleNodeBase *)pNVar2,fVar10,fVar9);
          iVar6 = iVar6 + 1;
          local_78 = this->spacing * local_88 + local_4c;
          goto LAB_00136162;
        }
        local_68._0_4_ = (float)local_68._0_4_ + (this->spacing + local_34) * (float)local_48._0_4_;
        local_78 = this->margin * local_88;
        iVar6 = 0;
      }
    }
  }
  return;
}

Assistant:

void LayoutEngine::updateLayout(Node *parentNode)
{
    if (layoutType == Grid_Horizontal || layoutType == Grid_Vertical) {
        assert(cellWidth != 0 || (width != 0 && columnCount > 0));
        assert(cellHeight != 0 || (height != 0 && rowCount > 0));

        int index = 0;

        float cw, ch, xSign, ySign;

        if (cellHeight != 0) {
             cw = std::abs(cellWidth);
             xSign = cellWidth > 0 ? 1 : -1;
        } else {
            cw = (std::abs(width) - 2 * margin - (columnCount - 1) * spacing) / columnCount;
            xSign = width > 0 ? 1 : -1;
        }

        if (cellHeight != 0) {
            ch = std::abs(cellHeight);
            ySign = cellHeight < 0 ? -1 : 1;
        } else {
            ch = (std::abs(height) - 2 * margin - (rowCount - 1) * spacing) / rowCount;
            ySign = height < 0 ? -1 : 1;
        }

        logd << (layoutType == Grid_Horizontal ? "horizontal" : "vertical")
             << "-grid: cell=" << cw << "x" << ch
             << ", dim=" << width << "x" << height << ", margin=" << margin << ", spacing=" << spacing
             << std::endl;

        const int itemsPer = layoutType == Grid_Horizontal
                             ? (columnCount > 0 ? columnCount : std::numeric_limits<int>::max())
                             : (rowCount > 0 ? rowCount : std::numeric_limits<int>::max());
        Node *node = parentNode->child();
        while (node) {
            RectangleNodeBase *rectNode = RectangleNodeBase::from(node);
            if (rectNode) {
                int r, c;
                if (layoutType == Grid_Horizontal) {
                    r = index / itemsPer;
                    c = index % itemsPer;
                } else {
                    r = index % itemsPer;
                    c = index / itemsPer;
                }

                rectNode->setGeometry(rect2d::fromXywh(x + xSign * (margin + c * cw + c * spacing),
                                                       y + ySign * (margin + r * ch + r * spacing),
                                                       xSign * cw,
                                                       ySign * ch).normalized());
                ++index;
            }
            node = node->sibling();
        }

    } else {

        int index = 0;
        int itemLimit;
        float sizeLimit;

        float posSign, offsetSign;

        if (layoutType == Flow_Horizontal) {
            posSign = width < 0 ? -1 : 1;
            offsetSign = height < 0 ? -1 : 1;
            itemLimit = columnCount > 0 ? columnCount : std::numeric_limits<int>::max();
            sizeLimit = width != 0 ? width - posSign * margin * 2 : posSign * std::numeric_limits<float>::infinity();
        } else {
            posSign = height < 0 ? -1 : 1;
            offsetSign = width < 0 ? -1 : 1;
            itemLimit = rowCount > 0 ? rowCount : std::numeric_limits<int>::max();
            sizeLimit = height != 0 ? height - posSign * margin * 2 : posSign * std::numeric_limits<float>::infinity();
        }

        float pos = posSign * margin; // The position to place the node on the current line
        float offset = offsetSign * margin; // The position in the direction normal to the pos
        float offsetIncrement = 0;

        logd << (layoutType == Flow_Horizontal ? "horizontal" : "vertical")
             << "-flow: itemLimit=" << itemLimit << ", sizeLimit=" << sizeLimit
             << ", margin=" << margin << ", spacing=" << spacing
             << std::endl;

        Node *node = parentNode->child();
        while (node) {
            RectangleNodeBase *rectNode = RectangleNodeBase::from(node);
            if (rectNode) {
                float dim = layoutType == Flow_Horizontal ? rectNode->width() : rectNode->height();
                float end = pos + posSign * dim;
                bool fitsOnLine = (posSign * end <= posSign * sizeLimit && index < itemLimit);
                logd << " - pos=" << pos << ", dim=" << dim << ", end=" << end  << ", index=" << index << ", fitsOnLine=" << fitsOnLine << std::endl;

                if (fitsOnLine || index == 0) {
                    if (layoutType == Flow_Horizontal) {
                        offsetIncrement = std::max(offsetIncrement, rectNode->height());
                        rectNode->setPosition(x + posSign > 0 ? pos : pos - rectNode->width(),
                                              y + offsetSign > 0 ? offset : offset - rectNode->height());
                    } else {
                        offsetIncrement = std::max(offsetIncrement, rectNode->width());
                        rectNode->setPosition(x + offsetSign > 0 ? offset : offset - rectNode->width(),
                                              y + posSign > 0 ? pos : pos - rectNode->height());
                    }
                    ++index;
                    pos = end + posSign * spacing;
                    node = node->sibling();
                } else {
                    // If it doesn't fit, wrap to the next line..
                    offset += offsetSign * (offsetIncrement + spacing);
                    pos = posSign * margin;
                    index = 0;
                }
            } else {
                node = node->sibling();
            }
        }
    }
}